

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  TestEventRepeater *pTVar1;
  TestFactoryBase *pTVar2;
  UnitTestImpl *pUVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  OsStackTraceGetterInterface *pOVar6;
  undefined **ppuVar7;
  long lVar8;
  long lVar9;
  timeval now;
  timeval local_40;
  Test *this_00;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar3 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_info_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[8])(pTVar1);
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    lVar8 = local_40.tv_sec * 1000;
    lVar9 = local_40.tv_usec / 1000;
    if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar6 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar7 = &PTR__OsStackTraceGetterInterface_0013d438;
      pOVar6->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_0013d438;
      pUVar3->os_stack_trace_getter_ = pOVar6;
    }
    else {
      ppuVar7 = pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar7)[3])();
    pTVar2 = this->factory_;
    UnitTest::GetInstance();
    iVar5 = (*pTVar2->_vptr_TestFactoryBase[2])(pTVar2);
    this_00 = (Test *)CONCAT44(extraout_var,iVar5);
    bVar4 = Test::HasFatalFailure();
    if (!bVar4) {
      bVar4 = Test::IsSkipped();
      if (!bVar4) {
        Test::Run(this_00);
      }
    }
    lVar9 = lVar9 + lVar8;
    if (this_00 != (Test *)0x0) {
      if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
        pOVar6 = (OsStackTraceGetterInterface *)operator_new(8);
        ppuVar7 = &PTR__OsStackTraceGetterInterface_0013d438;
        pOVar6->_vptr_OsStackTraceGetterInterface =
             (_func_int **)&PTR__OsStackTraceGetterInterface_0013d438;
        pUVar3->os_stack_trace_getter_ = pOVar6;
      }
      else {
        ppuVar7 = pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
      }
      (*((_func_int **)ppuVar7)[3])();
      UnitTest::GetInstance();
      (*this_00->_vptr_Test[1])(this_00);
    }
    (this->result_).start_timestamp_ = lVar9;
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    (this->result_).elapsed_time_ = (local_40.tv_sec * 1000 - lVar9) + local_40.tv_usec / 1000;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[10])(pTVar1,this);
    pUVar3->current_test_info_ = (TestInfo *)0x0;
  }
  return;
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TimeInMillis start = internal::GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure or invoke
  // GTEST_SKIP().
  // Note that the object will not be null
  if (!Test::HasFatalFailure() && !Test::IsSkipped()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  if (test != nullptr) {
    // Deletes the test object.
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");
  }

  result_.set_start_timestamp(start);
  result_.set_elapsed_time(internal::GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(nullptr);
}